

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

void MOJOSHADER_freePreprocessData(MOJOSHADER_preprocessData *_data)

{
  void *pvVar1;
  code *UNRECOVERED_JUMPTABLE;
  MOJOSHADER_preprocessData *data;
  long lVar2;
  long lVar3;
  
  if (_data == &out_of_mem_data_preprocessor || _data == (MOJOSHADER_preprocessData *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = _data->free;
  if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
    UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
  }
  pvVar1 = _data->malloc_data;
  (*UNRECOVERED_JUMPTABLE)(_data->output,pvVar1);
  if (0 < _data->error_count) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->errors->error + lVar3),pvVar1);
      (*UNRECOVERED_JUMPTABLE)(*(void **)((long)&_data->errors->filename + lVar3),pvVar1);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < _data->error_count);
  }
  (*UNRECOVERED_JUMPTABLE)(_data->errors,pvVar1);
  (*UNRECOVERED_JUMPTABLE)(_data,pvVar1);
  return;
}

Assistant:

void MOJOSHADER_freePreprocessData(const MOJOSHADER_preprocessData *_data)
{
    MOJOSHADER_preprocessData *data = (MOJOSHADER_preprocessData *) _data;
    if ((data == NULL) || (data == &out_of_mem_data_preprocessor))
        return;

    MOJOSHADER_free f = (data->free == NULL) ? MOJOSHADER_internal_free : data->free;
    void *d = data->malloc_data;
    int i;

    f((void *) data->output, d);

    for (i = 0; i < data->error_count; i++)
    {
        f((void *) data->errors[i].error, d);
        f((void *) data->errors[i].filename, d);
    } // for
    f(data->errors, d);

    f(data, d);
}